

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMaker.h
# Opt level: O0

string * ApprovalTests::StringMaker::toString<char[67]>(char (*contents) [67])

{
  char *in_RSI;
  string *in_RDI;
  stringstream s;
  stringstream local_198 [16];
  ostream local_188;
  char *local_10;
  
  local_10 = in_RSI;
  ::std::__cxx11::stringstream::stringstream(local_198);
  ::std::operator<<(&local_188,local_10);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

static std::string toString(const T& contents)
        {
            std::stringstream s;
            s << contents;
            return s.str();
        }